

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

ScriptWitness * __thiscall
cfd::core::Transaction::SetScriptWitnessStack
          (ScriptWitness *__return_storage_ptr__,Transaction *this,uint32_t tx_in_index,
          uint32_t witness_index,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  uint32_t index;
  AbstractTxIn *this_00;
  ByteData local_68;
  ScriptWitness local_50;
  ScriptWitness *local_30;
  ScriptWitness *witness;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  uint32_t witness_index_local;
  uint32_t tx_in_index_local;
  Transaction *this_local;
  
  witness = (ScriptWitness *)data;
  data_local._0_4_ = witness_index;
  data_local._4_4_ = tx_in_index;
  _witness_index_local = this;
  this_local = (Transaction *)__return_storage_ptr__;
  AbstractTransaction::SetScriptWitnessStack
            (&this->super_AbstractTransaction,tx_in_index,witness_index,data);
  this_00 = &::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator[]
                       (&this->vin_,(ulong)data_local._4_4_)->super_AbstractTxIn;
  index = (uint32_t)data_local;
  ByteData::ByteData(&local_68,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)witness);
  AbstractTxIn::SetScriptWitnessStack(&local_50,this_00,index,&local_68);
  ByteData::~ByteData((ByteData *)0x43732d);
  local_30 = &local_50;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[10])(this,8);
  ScriptWitness::ScriptWitness(__return_storage_ptr__,local_30);
  ScriptWitness::~ScriptWitness((ScriptWitness *)0x437367);
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness Transaction::SetScriptWitnessStack(
    uint32_t tx_in_index, uint32_t witness_index,
    const std::vector<uint8_t> &data) {
  AbstractTransaction::SetScriptWitnessStack(tx_in_index, witness_index, data);

  const ScriptWitness &witness =
      vin_[tx_in_index].SetScriptWitnessStack(witness_index, ByteData(data));
  CallbackStateChange(kStateChangeUpdateSignTxIn);
  return witness;
}